

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O3

bool dxil_spv::emit_physical_buffer_load_instruction
               (Impl *impl,CallInst *instruction,PhysicalPointerMeta *ptr_meta,uint32_t mask,
               uint32_t alignment)

{
  uint32_t uVar1;
  Builder *this;
  bool bVar2;
  Id IVar3;
  uint uVar4;
  Id IVar5;
  Id arg;
  Type *pTVar6;
  Value *value;
  Operation *pOVar7;
  Operation *this_00;
  mapped_type *pmVar8;
  LoggingCallback p_Var9;
  void *pvVar10;
  CallInst *instruction_00;
  uint uVar11;
  Id physical_type_id;
  Op value_cast_op;
  PhysicalPointerMeta tmp_ptr_meta;
  Id local_107c;
  uint32_t local_1078;
  uint local_1074;
  Op local_1070;
  uint32_t local_106c;
  Builder *local_1068;
  uint32_t local_105c;
  CallInst *local_1058;
  Type *local_1050;
  PhysicalPointerMeta *local_1048;
  CallInst *local_1040;
  PhysicalPointerMeta local_1038 [342];
  
  local_1078 = mask;
  local_106c = alignment;
  local_1068 = Converter::Impl::builder(impl);
  if (((mask == 0) &&
      (bVar2 = get_constant_operand(&instruction->super_Instruction,4,&local_1078), !bVar2)) ||
     ((alignment == 0 &&
      (bVar2 = get_constant_operand(&instruction->super_Instruction,5,&local_106c), !bVar2)))) {
LAB_001742b9:
    bVar2 = false;
  }
  else {
    uVar1 = local_1078;
    uVar11 = 1;
    if (local_1078 != 1) {
      if (local_1078 == 3) {
        uVar11 = 2;
      }
      else if (local_1078 == 0xf) {
        uVar11 = 4;
      }
      else {
        if (local_1078 != 7) {
          p_Var9 = get_thread_log_callback();
          if (p_Var9 != (LoggingCallback)0x0) {
            snprintf(&local_1038[0].nonwritable,0x1000,"Unexpected mask for RawBufferLoad = %u.\n",
                     (ulong)local_1078);
            pvVar10 = get_thread_log_callback_userdata();
            (*p_Var9)(pvVar10,Error,&local_1038[0].nonwritable);
            return false;
          }
          emit_physical_buffer_load_instruction();
          goto LAB_001742b9;
        }
        uVar11 = 3;
      }
    }
    pTVar6 = LLVMBC::Value::getType((Value *)instruction);
    pTVar6 = LLVMBC::Type::getStructElementType(pTVar6,0);
    local_1058 = instruction;
    IVar3 = build_vectorized_physical_load_store_access(impl,instruction,uVar11,pTVar6);
    local_1050 = pTVar6;
    get_physical_load_store_cast_info(impl,pTVar6,&local_107c,&local_1070);
    if (uVar1 != 1) {
      local_107c = spv::Builder::makeVectorType(local_1068,local_107c,uVar11);
    }
    local_1038[0].size = ptr_meta->size;
    local_1038[0].nonwritable = ptr_meta->nonwritable;
    local_1038[0].nonreadable = ptr_meta->nonreadable;
    local_1038[0].coherent = ptr_meta->coherent;
    local_1038[0].rov = ptr_meta->rov;
    local_1038[0].stride = ptr_meta->stride;
    local_1038[0]._5_3_ = *(undefined3 *)&ptr_meta->field_0x5;
    local_105c = uVar1;
    local_1074 = uVar11;
    local_1048 = ptr_meta;
    if (IVar3 == 0) {
      local_1038[0].stride = '\0';
      IVar5 = Converter::Impl::get_physical_pointer_block_type(impl,local_107c,local_1038);
      instruction_00 = local_1058;
      arg = build_physical_pointer_address_for_raw_load_store(impl,local_1058);
    }
    else {
      uVar4 = get_type_scalar_alignment(impl,local_1050);
      local_1038[0].stride = (char)uVar4 * (char)uVar11;
      IVar5 = Converter::Impl::get_physical_pointer_block_type(impl,local_107c,local_1038);
      instruction_00 = local_1058;
      value = LLVMBC::Instruction::getOperand(&local_1058->super_Instruction,1);
      arg = Converter::Impl::get_id_for_value(impl,value,0);
    }
    emit_buffer_synchronization_validation(impl,instruction_00,Load);
    pOVar7 = Converter::Impl::allocate(impl,OpBitcast,IVar5);
    Operation::add_id(pOVar7,arg);
    Converter::Impl::add(impl,pOVar7,false);
    this = local_1068;
    IVar5 = spv::Builder::makePointer(local_1068,StorageClassPhysicalStorageBuffer,local_107c);
    this_00 = Converter::Impl::allocate(impl,OpInBoundsAccessChain,IVar5);
    Operation::add_id(this_00,pOVar7->id);
    IVar5 = spv::Builder::makeIntegerType(this,0x20,false);
    IVar5 = spv::Builder::makeIntConstant(this,IVar5,0,false);
    Operation::add_id(this_00,IVar5);
    if (IVar3 != 0) {
      Operation::add_id(this_00,IVar3);
    }
    Converter::Impl::add(impl,this_00,false);
    pOVar7 = Converter::Impl::allocate(impl,OpLoad,local_107c);
    Operation::add_id(pOVar7,this_00->id);
    Operation::add_literal(pOVar7,2);
    Operation::add_literal(pOVar7,local_106c);
    Converter::Impl::add(impl,pOVar7,local_1048->rov);
    uVar1 = local_105c;
    IVar3 = pOVar7->id;
    uVar11 = local_1074;
    if (local_1070 != OpNop) {
      IVar5 = Converter::Impl::get_type_id(impl,local_1050,0);
      uVar11 = local_1074;
      if (uVar1 != 1) {
        IVar5 = spv::Builder::makeVectorType(local_1068,IVar5,local_1074);
      }
      pOVar7 = Converter::Impl::allocate(impl,local_1070,IVar5);
      Operation::add_id(pOVar7,IVar3);
      Converter::Impl::add(impl,pOVar7,false);
      IVar3 = pOVar7->id;
    }
    Converter::Impl::rewrite_value(impl,(Value *)instruction_00,IVar3);
    if (uVar1 == 1) {
      local_1040 = instruction_00;
      pmVar8 = std::__detail::
               _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&impl->llvm_composite_meta,(key_type *)&local_1040);
      pmVar8->forced_composite = false;
    }
    build_exploded_composite_from_vector(impl,&instruction_00->super_Instruction,uVar11);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

static bool emit_physical_buffer_load_instruction(Converter::Impl &impl, const llvm::CallInst *instruction,
                                                  const Converter::Impl::PhysicalPointerMeta &ptr_meta,
                                                  uint32_t mask = 0, uint32_t alignment = 0)
{
	auto &builder = impl.builder();

	if (mask == 0 && !get_constant_operand(instruction, 4, &mask))
		return false;
	if (alignment == 0 && !get_constant_operand(instruction, 5, &alignment))
		return false;

	unsigned vecsize = 0;
	if (mask == 1)
		vecsize = 1;
	else if (mask == 3)
		vecsize = 2;
	else if (mask == 7)
		vecsize = 3;
	else if (mask == 15)
		vecsize = 4;
	else
	{
		LOGE("Unexpected mask for RawBufferLoad = %u.\n", mask);
		return false;
	}

	auto *element_type = instruction->getType()->getStructElementType(0);
	// If we can express this as a plain access chain, do so for clarity and ideally better perf.
	// If we cannot do it trivially, fallback to raw pointer arithmetic.
	spv::Id array_id = build_vectorized_physical_load_store_access(impl, instruction, vecsize, element_type);

	spv::Id physical_type_id;
	spv::Op value_cast_op;
	get_physical_load_store_cast_info(impl, element_type, physical_type_id, value_cast_op);

	if (vecsize > 1)
		physical_type_id = builder.makeVectorType(physical_type_id, vecsize);

	auto tmp_ptr_meta = ptr_meta;
	tmp_ptr_meta.stride = array_id ? vecsize * get_type_scalar_alignment(impl, element_type) : 0;
	spv::Id ptr_type_id = impl.get_physical_pointer_block_type(physical_type_id, tmp_ptr_meta);

	spv::Id u64_ptr_id;
	if (array_id)
		u64_ptr_id = impl.get_id_for_value(instruction->getOperand(1));
	else
		u64_ptr_id = build_physical_pointer_address_for_raw_load_store(impl, instruction);

	emit_buffer_synchronization_validation(impl, instruction, BDAOperation::Load);

	auto *ptr_bitcast_op = impl.allocate(spv::OpBitcast, ptr_type_id);
	ptr_bitcast_op->add_id(u64_ptr_id);
	impl.add(ptr_bitcast_op);

	auto *chain_op = impl.allocate(spv::OpInBoundsAccessChain,
								   builder.makePointer(spv::StorageClassPhysicalStorageBuffer, physical_type_id));
	chain_op->add_id(ptr_bitcast_op->id);
	chain_op->add_id(builder.makeUintConstant(0));
	if (array_id)
		chain_op->add_id(array_id);
	impl.add(chain_op);

	auto *load_op = impl.allocate(spv::OpLoad, physical_type_id);
	load_op->add_id(chain_op->id);
	load_op->add_literal(spv::MemoryAccessAlignedMask);
	load_op->add_literal(alignment);

	impl.add(load_op, ptr_meta.rov);

	spv::Id loaded_id = load_op->id;

	if (value_cast_op != spv::OpNop)
	{
		spv::Id type_id = impl.get_type_id(element_type);
		if (vecsize > 1)
			type_id = builder.makeVectorType(type_id, vecsize);
		auto *cast_op = impl.allocate(value_cast_op, type_id);
		cast_op->add_id(loaded_id);
		impl.add(cast_op);
		loaded_id = cast_op->id;
	}

	impl.rewrite_value(instruction, loaded_id);

	if (vecsize == 1)
		impl.llvm_composite_meta[instruction].forced_composite = false;

	build_exploded_composite_from_vector(impl, instruction, vecsize);

	return true;
}